

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtio.c
# Opt level: O0

void virtio_legacy_setup_tx_queue(virtio_device *dev,uint16_t idx)

{
  vring_used *pvVar1;
  uint16_t uVar2;
  uint num;
  size_t __n;
  vring *vr;
  mempool *pmVar3;
  ushort in_SI;
  long in_RDI;
  dma_memory dVar4;
  uint32_t notify_offset;
  size_t i;
  virtqueue *vq;
  dma_memory mem;
  size_t virt_queue_mem_size;
  uint32_t max_queue_size;
  undefined1 in_stack_00001a7f;
  size_t in_stack_00001a80;
  size_t in_stack_ffffffffffffffa8;
  uint8_t *offset;
  vring_avail *offset_00;
  undefined8 in_stack_ffffffffffffffb0;
  int fd;
  ulong local_38;
  uint8_t *local_28;
  
  if ((in_SI != 1) && (in_SI != 2)) {
    fprintf(_stderr,"[ERROR] %s:%d %s(): Can\'t setup queue %u as Tx queue\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
            0x31,"virtio_legacy_setup_tx_queue",(ulong)in_SI);
    abort();
  }
  write_io16((int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
             (uint16_t)((ulong)in_stack_ffffffffffffffb0 >> 0x10),in_stack_ffffffffffffffa8);
  uVar2 = read_io16((int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),in_stack_ffffffffffffffa8);
  num = (uint)uVar2;
  fprintf(_stderr,"[DEBUG] %s:%d %s(): Max queue size of tx queue #%u: %u\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
          0x37,"virtio_legacy_setup_tx_queue",(ulong)in_SI,
          CONCAT44((int)(in_stack_ffffffffffffffa8 >> 0x20),num));
  if (num != 0) {
    __n = virtio_legacy_vring_size(num,0x1000);
    dVar4 = memory_allocate_dma(in_stack_00001a80,(_Bool)in_stack_00001a7f);
    local_28 = (uint8_t *)dVar4.virt;
    memset(local_28,0xab,__n);
    offset = local_28;
    fprintf(_stderr,"[DEBUG] %s:%d %s(): Allocated %zu bytes for virt queue at %p\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
            0x3e,"virtio_legacy_setup_tx_queue",__n);
    write_io32((int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),(uint32_t)in_stack_ffffffffffffffb0,
               (size_t)offset);
    vr = (vring *)calloc(1,(ulong)num * 8 + 0x38);
    virtio_legacy_vring_init(vr,num,local_28,0x1000);
    offset_00 = vr->avail;
    fd = (int)((ulong)vr->used >> 0x20);
    fprintf(_stderr,"[DEBUG] %s:%d %s(): vring desc: %p, vring avail: %p, vring used: %p\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
            0x44,"virtio_legacy_setup_tx_queue",vr->desc);
    for (local_38 = 0; local_38 < vr->num; local_38 = local_38 + 1) {
      vr->desc[local_38].len = 0;
      vr->desc[local_38].addr = 0;
      vr->desc[local_38].flags = 0;
      vr->desc[local_38].next = 0;
      (&vr->avail[1].flags)[local_38] = 0;
      pvVar1 = vr->used;
      pvVar1[local_38 * 2 + 1].flags = 0;
      pvVar1[local_38 * 2 + 1].idx = 0;
      pvVar1 = vr->used;
      pvVar1[local_38 * 2 + 2].flags = 0;
      pvVar1[local_38 * 2 + 2].idx = 0;
    }
    vr->used->idx = 0;
    vr->avail->idx = 0;
    *(undefined2 *)&vr[1].desc = 0;
    uVar2 = read_io16(fd,(size_t)offset_00);
    fprintf(_stderr,"[DEBUG] %s:%d %s(): vq notifcation offset %u\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
            0x54,"virtio_legacy_setup_tx_queue",(ulong)(uint)uVar2);
    *(ulong *)(vr + 1) = (ulong)(uint)uVar2;
    if (in_SI == 2) {
      pmVar3 = memory_allocate_mempool((uint32_t)((ulong)vr >> 0x20),(uint32_t)vr);
      vr[1].avail = (vring_avail *)pmVar3;
    }
    vr->avail->flags = 1;
    vr->used->flags = 0;
    if (in_SI == 1) {
      *(vring **)(in_RDI + 0x80) = vr;
    }
    else {
      *(vring **)(in_RDI + 0x88) = vr;
    }
  }
  return;
}

Assistant:

static void virtio_legacy_setup_tx_queue(struct virtio_device* dev, uint16_t idx) {
	if (idx != 1 && idx != 2) {
		error("Can't setup queue %u as Tx queue", idx);
	}

	// Create virt queue itself - Section 4.1.5.1.3
	write_io16(dev->fd, idx, VIRTIO_PCI_QUEUE_SEL);
	uint32_t max_queue_size = read_io16(dev->fd, VIRTIO_PCI_QUEUE_NUM);
	debug("Max queue size of tx queue #%u: %u", idx, max_queue_size);
	if (max_queue_size == 0) {
		return;
	}
	size_t virt_queue_mem_size = virtio_legacy_vring_size(max_queue_size, 4096);
	struct dma_memory mem = memory_allocate_dma(virt_queue_mem_size, true);
	memset(mem.virt, 0xab, virt_queue_mem_size);
	debug("Allocated %zu bytes for virt queue at %p", virt_queue_mem_size, mem.virt);
	write_io32(dev->fd, mem.phy >> VIRTIO_PCI_QUEUE_ADDR_SHIFT, VIRTIO_PCI_QUEUE_PFN);

	// Section 2.4.2 for layout
	struct virtqueue* vq = calloc(1, sizeof(*vq) + sizeof(void*) * max_queue_size);
	virtio_legacy_vring_init(&vq->vring, max_queue_size, mem.virt, 4096);
	debug("vring desc: %p, vring avail: %p, vring used: %p", vq->vring.desc, vq->vring.avail, vq->vring.used);
	for (size_t i = 0; i < vq->vring.num; ++i) {
		vq->vring.desc[i].len = 0;
		vq->vring.desc[i].addr = 0;
		vq->vring.desc[i].flags = 0;
		vq->vring.desc[i].next = 0;
		vq->vring.avail->ring[i] = 0;
		vq->vring.used->ring[i].id = 0;
		vq->vring.used->ring[i].len = 0;
	}
	vq->vring.used->idx = 0;
	vq->vring.avail->idx = 0;
	vq->vq_used_last_idx = 0;

	// Section 4.1.4.4
	uint32_t notify_offset = read_io16(dev->fd, VIRTIO_PCI_QUEUE_NOTIFY);
	debug("vq notifcation offset %u", notify_offset);
	vq->notification_offset = notify_offset;

	// Ctrl queue packets are not supplied by the user
	if (idx == 2) {
		vq->mempool = memory_allocate_mempool(max_queue_size, 2048);
	}

	// Disable interrupts - Section 2.4.7
	vq->vring.avail->flags = VRING_AVAIL_F_NO_INTERRUPT;
	vq->vring.used->flags = 0;

	if (idx == 1) {
		dev->tx_queue = vq;
	} else {
		dev->ctrl_queue = vq;
	}
}